

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O2

void __thiscall
PFData_test_loadDataAbs_Test::PFData_test_loadDataAbs_Test(PFData_test_loadDataAbs_Test *this)

{
  PFData_test::PFData_test(&this->super_PFData_test);
  (this->super_PFData_test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00159488;
  return;
}

Assistant:

TEST_F(PFData_test, loadDataAbs) {
    // this file needs to exist, and should load
    char filename[2048];
    getcwd(filename,2048);
    strcat(filename,"/tests/inputs/press.init.pfb");
    PFData test(filename);
    int retval = test.loadHeader();
    ASSERT_EQ(0,retval);
    retval = test.loadData();
    ASSERT_EQ(0,retval);
    double* data = test.getData();
    EXPECT_NE(nullptr, data);
    EXPECT_NEAR(98.003604098773,test(0,0,0),1E-12);
    EXPECT_NEAR(97.36460429313328,test(0,0,40),1E-12);
    EXPECT_NEAR(98.0043134691891,test(0,1,0),1E-12);
    EXPECT_NEAR(98.00901307022781,test(0,0,1),1E-12);
    EXPECT_NEAR(92.61370155558751,test(2,1,21),1E-12);
    EXPECT_NEAR(7.98008728357588,test(45,1,0),1E-12);
    EXPECT_NEAR(97.30205516102234,test(0,1,22),1E-12);

    EXPECT_NEAR(95.173603867758615, test(0, 40, 40), 1E-12);
    EXPECT_NEAR(98.006254316614971, test(0, 39, 39), 1E-12);
    test.close();
}